

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz-test.c++
# Opt level: O1

void __thiscall
capnp::_::anon_unknown_0::fuzz<capnp::_::(anonymous_namespace)::TextChecker>
          (anon_unknown_0 *this,ArrayPtr<capnp::word> data,uint flipCount,uint startAt,uint endAt)

{
  int iVar1;
  anon_unknown_0 aVar2;
  uint uVar3;
  anon_unknown_0 aVar4;
  ArrayPtr<capnp::word> data_00;
  ArrayPtr<capnp::word> data_01;
  ArrayPtr<capnp::word> data_02;
  undefined1 in_stack_00000018 [16];
  
  data_00.ptr = data.ptr;
  if ((int)data.size_ != 0) {
    if (flipCount < startAt) {
      iVar1 = (int)data.size_ + -1;
      do {
        uVar3 = flipCount >> 3;
        aVar2 = this[uVar3];
        aVar4 = SUB41(1 << ((byte)flipCount & 7),0);
        this[uVar3] = (anon_unknown_0)((byte)aVar2 | (byte)aVar4);
        flipCount = flipCount + 1;
        data_00.size_._0_4_ = iVar1;
        data_00.size_._4_4_ = 0;
        fuzz<capnp::_::(anonymous_namespace)::TextChecker>(this,data_00,flipCount,startAt,endAt);
        this[uVar3] = (anon_unknown_0)((byte)this[uVar3] & ~(byte)aVar4);
        data_01.size_._0_4_ = iVar1;
        data_01.ptr = data_00.ptr;
        data_01.size_._4_4_ = 0;
        fuzz<capnp::_::(anonymous_namespace)::TextChecker>(this,data_01,flipCount,startAt,endAt);
        this[uVar3] = aVar4;
        data_02.size_._0_4_ = iVar1;
        data_02.ptr = data_00.ptr;
        data_02.size_._4_4_ = 0;
        fuzz<capnp::_::(anonymous_namespace)::TextChecker>(this,data_02,flipCount,startAt,endAt);
        this[uVar3] = aVar2;
      } while (startAt != flipCount);
    }
    return;
  }
  traverseCatchingExceptions<capnp::_::(anonymous_namespace)::TextChecker>
            ((ArrayPtr<const_capnp::word>)in_stack_00000018);
  return;
}

Assistant:

void fuzz(kj::ArrayPtr<word> data, uint flipCount, uint startAt, uint endAt) {
  if (flipCount == 0) {
    traverseCatchingExceptions<Checker>(data);
  } else {
    for (uint i = startAt; i < endAt; i++) {
      byte bit = 1u << (i % 8);
      byte old = data.asBytes()[i / 8];
      data.asBytes()[i / 8] |= bit;
      fuzz<Checker>(data, flipCount - 1, i + 1, endAt);
      data.asBytes()[i / 8] &= ~bit;
      fuzz<Checker>(data, flipCount - 1, i + 1, endAt);
      data.asBytes()[i / 8] = bit;
      fuzz<Checker>(data, flipCount - 1, i + 1, endAt);
      data.asBytes()[i / 8] = old;
    }
  }
}